

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  FilePath output_dir;
  FilePath output_file_path;
  FILE *fileout;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  FilePath *in_stack_ffffffffffffff60;
  GTestLog local_84 [11];
  FilePath *in_stack_ffffffffffffffa8;
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  GTestLogSeverity in_stack_ffffffffffffffcc;
  GTestLog *in_stack_ffffffffffffffd0;
  FILE *local_10;
  
  local_10 = (FILE *)0x0;
  std::__cxx11::string::string(local_50,in_RDI);
  FilePath::FilePath(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_50);
  FilePath::RemoveFileName((FilePath *)in_RDI);
  bVar1 = FilePath::CreateDirectoriesRecursively(in_stack_ffffffffffffffa8);
  if (bVar1) {
    std::__cxx11::string::c_str();
    local_10 = posix::FOpen(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  if (local_10 == (FILE *)0x0) {
    GTestLog::GTestLog(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0
                       ,in_stack_ffffffffffffffbc);
    poVar2 = GTestLog::GetStream(local_84);
    poVar2 = std::operator<<(poVar2,"Unable to open file \"");
    poVar2 = std::operator<<(poVar2,in_RDI);
    std::operator<<(poVar2,"\"");
    GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  FilePath::~FilePath((FilePath *)0x196567);
  FilePath::~FilePath((FilePath *)0x196574);
  return local_10;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}